

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::findBucketWithHash<QString>
          (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *this,QString *key,size_t hash)

{
  ulong uVar1;
  Span *pSVar2;
  char16_t *pcVar3;
  long lVar4;
  byte bVar5;
  char cVar6;
  Span *pSVar7;
  ulong uVar8;
  QStringView QVar9;
  Bucket BVar10;
  QStringView QVar11;
  
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  uVar8 = uVar1 - 1 & hash;
  pSVar7 = pSVar2 + (uVar8 >> 7);
  uVar8 = (ulong)((uint)uVar8 & 0x7f);
  bVar5 = pSVar7->offsets[uVar8];
  if (bVar5 != 0xff) {
    pcVar3 = (key->d).ptr;
    lVar4 = (key->d).size;
    do {
      if ((*(long *)((pSVar7->entries->storage).data + (ulong)((uint)bVar5 * 0x30) + 0x10) == lVar4)
         && (QVar9.m_data = *(storage_type_conflict **)
                             ((pSVar7->entries->storage).data + (ulong)((uint)bVar5 * 0x30) + 8),
            QVar9.m_size = lVar4, QVar11.m_data = pcVar3, QVar11.m_size = lVar4,
            cVar6 = QtPrivate::equalStrings(QVar9,QVar11), cVar6 != '\0')) break;
      uVar8 = uVar8 + 1;
      if (uVar8 == 0x80) {
        pSVar7 = pSVar7 + 1;
        if (((long)pSVar7 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (uVar1 >> 7) == 0) {
          pSVar7 = pSVar2;
        }
        uVar8 = 0;
      }
      bVar5 = pSVar7->offsets[uVar8];
    } while (bVar5 != 0xff);
  }
  BVar10.index = uVar8;
  BVar10.span = pSVar7;
  return BVar10;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }